

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_cast_char_test.cpp
# Opt level: O1

void __thiscall
reflect_value_cast_char_test_char_to_float_cast_Test::TestBody
          (reflect_value_cast_char_test_char_to_float_cast_Test *this)

{
  char cVar1;
  undefined8 uVar2;
  char *message;
  AssertionResult gtest_ar;
  float local_40;
  undefined4 uStack_3c;
  AssertHelper local_38;
  internal local_30 [8];
  undefined8 *local_28;
  
  uVar2 = value_create_char(0x43);
  cVar1 = value_to_char(uVar2);
  uVar2 = value_type_cast(uVar2,5);
  local_40 = (float)(int)cVar1;
  local_38.data_._0_4_ = value_to_float(uVar2);
  testing::internal::CmpHelperEQ<float,float>
            (local_30,"(float)c","(float)value_to_float(v)",&local_40,(float *)&local_38);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_28 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (char *)*local_28;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_value_cast_test/source/reflect_value_cast_char_test.cpp"
               ,0x68,message);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((long *)CONCAT44(uStack_3c,local_40) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_3c,local_40) + 8))();
    }
  }
  if (local_28 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_28 != local_28 + 2) {
      operator_delete((undefined8 *)*local_28);
    }
    operator_delete(local_28);
  }
  value_destroy(uVar2);
  return;
}

Assistant:

TEST_F(reflect_value_cast_char_test, char_to_float_cast)
{
	value v = value_create_char('C');

	char c = value_to_char(v);

	v = value_type_cast(v, TYPE_FLOAT);

	EXPECT_EQ((float)c, (float)value_to_float(v));

	value_destroy(v);
}